

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O0

void line_tick(t_line_conflict *x)

{
  double dVar1;
  double local_30;
  double msectogo;
  double timenow;
  t_line_conflict *x_local;
  
  dVar1 = clock_getsystime();
  local_30 = clock_gettimesince(x->x_targettime);
  local_30 = -local_30;
  if (1e-09 <= local_30) {
    outlet_float((x->x_obj).te_outlet,
                 (float)(x->x_1overtimediff * (dVar1 - x->x_prevtime) *
                         (double)(x->x_targetval - x->x_setval) + (double)x->x_setval));
    if (x->x_grain <= 0.0) {
      x->x_grain = 20.0;
    }
    if ((double)x->x_grain <= local_30) {
      local_30 = (double)x->x_grain;
    }
    clock_delay(x->x_clock,local_30);
  }
  else {
    outlet_float((x->x_obj).te_outlet,x->x_targetval);
  }
  return;
}

Assistant:

static void line_tick(t_line *x)
{
    double timenow = clock_getsystime();
    double msectogo = - clock_gettimesince(x->x_targettime);
    if (msectogo < 1E-9)
    {
        outlet_float(x->x_obj.ob_outlet, x->x_targetval);
    }
    else
    {
        outlet_float(x->x_obj.ob_outlet,
            x->x_setval + x->x_1overtimediff * (timenow - x->x_prevtime)
                * (x->x_targetval - x->x_setval));
        if (x->x_grain <= 0)
            x->x_grain = DEFAULTLINEGRAIN;
        clock_delay(x->x_clock,
            (x->x_grain > msectogo ? msectogo : x->x_grain));
    }
}